

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O2

fdb_status
wal_commit(fdb_txn *txn,filemgr *file,wal_commit_mark_func *func,err_log_callback *log_callback)

{
  byte *pbVar1;
  wal_item *pwVar2;
  uint32_t uVar3;
  fdb_status status;
  list_elem *e;
  ulong uVar4;
  ulong uVar5;
  wal_item *item;
  fdb_kvs_id_t kv_id;
  long local_48;
  wal_commit_mark_func *local_40;
  list_elem *local_38;
  
  e = txn->items->head;
  local_38 = (list_elem *)&file->global_txn;
  local_48 = 0;
  local_40 = func;
  do {
    if (e == (list_elem *)0x0) {
      status = FDB_RESULT_SUCCESS;
LAB_001368c0:
      atomic_sub_uint64_t(&file->wal->mem_overhead,local_48,memory_order_relaxed);
      return status;
    }
    if (e[-3].prev != (list_elem *)txn->txn_id) {
      fdb_assert_die("item->txn_id == txn->txn_id",
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/wal.cc"
                     ,0x4ee,(uint64_t)e[-3].prev,txn->txn_id);
    }
    uVar3 = get_checksum((uint8_t *)e[-4].prev[1].next,(ulong)*(ushort *)&e[-4].prev[2].prev);
    uVar4 = (ulong)uVar3 % file->wal->num_shards;
    pthread_spin_lock(&file->wal->key_shards[uVar4].lock);
    if (((ulong)e[-2].prev & 0x100) == 0) {
      if (((ulong)e[-2].prev & 0x400) == 0) {
        kv_id = 0;
      }
      else {
        buf2kvid((ulong)*(byte *)((long)&e[-4].prev[2].prev + 2),e[-4].prev[1].next,&kv_id);
      }
      LOCK();
      pbVar1 = (byte *)((long)&e[-2].prev + 1);
      *pbVar1 = *pbVar1 | 1;
      UNLOCK();
      if (e[-4].next != local_38) {
        atomic_incr_uint32_t(&file->wal->num_flushable,memory_order_seq_cst);
        _wal_update_stat(file,kv_id,(uint)(*(char *)&e[-2].prev == '\0'));
      }
      if ((func != (wal_commit_mark_func *)0x0) &&
         (status = (*func)(txn->handle,(uint64_t)e[-2].next), status != FDB_RESULT_SUCCESS)) {
        fdb_log_impl(log_callback,2,status,
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/wal.cc"
                     ,"wal_commit",0x511,
                     "Error in appending a commit mark at offset %lu in a database file \'%s\'",
                     e[-2].next,file->filename);
        pthread_spin_unlock(&file->wal->key_shards[uVar4].lock);
        goto LAB_001368c0;
      }
      list_remove((list *)&e[-4].prev[2].next,(list_elem *)&e[-7].next);
      list_push_back((list *)&e[-4].prev[2].next,(list_elem *)&e[-7].next);
      item = (wal_item *)e[-7].next;
      while ((func = local_40, item != (wal_item *)0x0 &&
             (((item->flag).super___atomic_base<unsigned_char>._M_i & 1) != 0))) {
        pwVar2 = (wal_item *)(item->list_elem).prev;
        if (((item->flag).super___atomic_base<unsigned_char>._M_i & 2) == 0) {
          list_remove((list *)&e[-4].prev[2].next,&item->list_elem);
          if (file->config->seqtree_opt == '\x01') {
            uVar5 = item->seqnum % file->wal->num_shards;
            pthread_spin_lock(&file->wal->seq_shards[uVar5].lock);
            avl_remove(&file->wal->seq_shards[uVar5]._map,&item->avl_seq);
            pthread_spin_unlock(&file->wal->seq_shards[uVar5].lock);
          }
          if (item->action < 2) {
            filemgr_mark_stale(file,item->offset,(ulong)item->doc_size);
          }
          atomic_decr_uint32_t(&file->wal->size,memory_order_seq_cst);
          atomic_decr_uint32_t(&file->wal->num_flushable,memory_order_seq_cst);
          if (*(char *)&e[-2].prev != '\x02') {
            atomic_sub_uint64_t(&file->wal->datasize,(ulong)item->doc_size,memory_order_relaxed);
          }
          _wal_update_stat(file,kv_id,(item->action == '\0') + _WAL_DROP_DELETE);
          local_48 = local_48 + 0x80;
          _wal_free_item(item,file->wal);
          item = pwVar2;
        }
        else {
          fdb_log_impl(log_callback,5,FDB_RESULT_SUCCESS,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/wal.cc"
                       ,"wal_commit",0x557,
                       "Wal commit called when wal_flush in progress.item seqnum %lu keylen %d flags %x action %d%s"
                       ,item->seqnum,(ulong)*(ushort *)&e[-4].prev[2].prev,
                       (ulong)(item->flag).super___atomic_base<unsigned_char>._M_i,
                       (ulong)item->action,file->filename);
          item = pwVar2;
        }
      }
    }
    e = list_remove(txn->items,e);
    pthread_spin_unlock(&file->wal->key_shards[uVar4].lock);
  } while( true );
}

Assistant:

fdb_status wal_commit(fdb_txn *txn, struct filemgr *file,
                      wal_commit_mark_func *func,
                      err_log_callback *log_callback)
{
    int can_overwrite;
    struct wal_item *item, *_item;
    struct list_elem *e1, *e2;
    fdb_kvs_id_t kv_id;
    fdb_status status = FDB_RESULT_SUCCESS;
    size_t shard_num;
    uint64_t mem_overhead = 0;

    e1 = list_begin(txn->items);
    while(e1) {
        item = _get_entry(e1, struct wal_item, list_elem_txn);
        fdb_assert(item->txn_id == txn->txn_id, item->txn_id, txn->txn_id);
        // Grab the WAL key shard lock.
        shard_num = get_checksum((uint8_t*)item->header->key,
                                 item->header->keylen) %
                                 file->wal->num_shards;
        spin_lock(&file->wal->key_shards[shard_num].lock);

        if (!(item->flag & WAL_ITEM_COMMITTED)) {
            // get KVS ID
            if (item->flag & WAL_ITEM_MULTI_KV_INS_MODE) {
                buf2kvid(item->header->chunksize, item->header->key, &kv_id);
            } else {
                kv_id = 0;
            }

            item->flag |= WAL_ITEM_COMMITTED;
            if (item->txn != &file->global_txn) {
                // increase num_flushable if it is transactional update
                atomic_incr_uint32_t(&file->wal->num_flushable);
                // Also since a transaction doc was committed
                // update global WAL stats to reflect this change..
                if (item->action == WAL_ACT_INSERT) {
                    _wal_update_stat(file, kv_id, _WAL_NEW_SET);
                } else {
                    _wal_update_stat(file, kv_id, _WAL_NEW_DEL);
                }
            }
            // append commit mark if necessary
            if (func) {
                status = func(txn->handle, item->offset);
                if (status != FDB_RESULT_SUCCESS) {
                    fdb_log(log_callback, FDB_LOG_ERROR, status,
                            "Error in appending a commit mark at offset %"
                            _F64 " in "
                            "a database file '%s'", item->offset,
                            file->filename);
                    spin_unlock(&file->wal->key_shards[shard_num].lock);
                    atomic_sub_uint64_t(&file->wal->mem_overhead, mem_overhead,
                                        std::memory_order_relaxed);
                    return status;
                }
            }
            // remove previously committed item if no snapshots refer to it,
            // move the committed item to the end of the wal_item_header's list
            list_remove(&item->header->items, &item->list_elem);
            list_push_back(&item->header->items, &item->list_elem);
            // now reverse scan among other committed items to de-duplicate..
            e2 = list_prev(&item->list_elem);
            while(e2) {
                _item = _get_entry(e2, struct wal_item, list_elem);
                if (!(_item->flag & WAL_ITEM_COMMITTED)) {
                    break;
                }
                e2 = list_prev(e2);
                can_overwrite = (item->shandle == _item->shandle ||
                                 _wal_can_discard(file->wal, _item, item));
                if (!can_overwrite) {
                    item = _item; // new covering item found
                    continue;
                }
                // committed but not flush-ready
                // (flush-readied item will be removed by flushing)
                if (!(_item->flag & WAL_ITEM_FLUSH_READY)) {
                    // remove from list & hash
                    list_remove(&item->header->items, &_item->list_elem);
                    if (file->config->seqtree_opt == FDB_SEQTREE_USE) {
                        size_t seq_shard_num = _item->seqnum
                                             % file->wal->num_shards;
                        spin_lock(&file->wal->seq_shards[seq_shard_num].lock);
                        avl_remove(&file->wal->seq_shards[seq_shard_num]._map,
                                   &_item->avl_seq);
                        spin_unlock(&file->wal->seq_shards[seq_shard_num].lock);
                    }

                    // mark previous doc region as stale
                    uint32_t stale_len = _item->doc_size;
                    uint64_t stale_offset = _item->offset;
                    if (_item->action == WAL_ACT_INSERT ||
                        _item->action == WAL_ACT_LOGICAL_REMOVE) {
                        // insert or logical remove
                        filemgr_mark_stale(file, stale_offset, stale_len);
                    }

                    atomic_decr_uint32_t(&file->wal->size);
                    atomic_decr_uint32_t(&file->wal->num_flushable);
                    if (item->action != WAL_ACT_REMOVE) {
                        atomic_sub_uint64_t(&file->wal->datasize,
                                            _item->doc_size,
                                            std::memory_order_relaxed);
                    }
                    // simply reduce the stat count...
                    if (_item->action == WAL_ACT_INSERT) {
                        _wal_update_stat(file, kv_id, _WAL_DROP_SET);
                    } else {
                        _wal_update_stat(file, kv_id, _WAL_DROP_DELETE);
                    }
                    mem_overhead += sizeof(struct wal_item);
                    _wal_free_item(_item, file->wal);
                } else {
                    fdb_log(log_callback, FDB_LOG_DEBUG, status,
                            "Wal commit called when wal_flush in progress."
                            "item seqnum %" _F64
                            " keylen %d flags %x action %d"
                            "%s", _item->seqnum, item->header->keylen,
                            atomic_get_uint8_t(&_item->flag),
                            _item->action, file->filename);
                }
            }
        }

        // remove from transaction's list
        e1 = list_remove(txn->items, e1);
        spin_unlock(&file->wal->key_shards[shard_num].lock);
    }
    atomic_sub_uint64_t(&file->wal->mem_overhead, mem_overhead,
                        std::memory_order_relaxed);

    return status;
}